

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O0

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::SafeReleaseResource
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this,
          DynamicStaleResourceWrapper *Wrapper,Uint64 NextCommandListNumber)

{
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> LockGuard;
  Uint64 NextCommandListNumber_local;
  DynamicStaleResourceWrapper *Wrapper_local;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_local;
  
  LockGuard._M_device = (mutex_type *)NextCommandListNumber;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->m_StaleObjectsMutex);
  std::
  deque<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::STDAllocator<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::IMemoryAllocator>>
  ::emplace_back<unsigned_long&,Diligent::DynamicStaleResourceWrapper_const&>
            ((deque<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::STDAllocator<std::pair<unsigned_long,Diligent::DynamicStaleResourceWrapper>,Diligent::IMemoryAllocator>>
              *)&this->m_StaleResources,(unsigned_long *)&LockGuard,Wrapper);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void SafeReleaseResource(const ResourceWrapperType& Wrapper, Uint64 NextCommandListNumber)
    {
        std::lock_guard<std::mutex> LockGuard(m_StaleObjectsMutex);
        m_StaleResources.emplace_back(NextCommandListNumber, Wrapper);
    }